

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O2

bool __thiscall
poplar::
compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::compare_dsp_(compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *this,uint64_t slot_id,uint64_t rhs)

{
  uint64_t uVar1;
  ulong uVar2;
  
  uVar1 = compact_vector::get(&this->table_,slot_id);
  uVar2 = (ulong)((uint)uVar1 & 0xf);
  if (uVar2 == 0xf) {
    if (rhs < 0xf) {
      return false;
    }
    uVar1 = compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::get
                      (&this->aux_cht_,slot_id);
    if (uVar1 == 0xffffffffffffffff) {
      if (rhs < 0x8e) {
        return false;
      }
      uVar2 = standard_hash_table<80U,_poplar::hash::vigna_hasher>::get(&this->aux_map_,slot_id);
    }
    else {
      uVar2 = uVar1 + 0xf;
    }
  }
  return uVar2 == rhs;
}

Assistant:

bool compare_dsp_(uint64_t slot_id, uint64_t rhs) const {
        uint64_t lhs = table_[slot_id] & dsp1_mask;
        if (lhs < dsp1_mask) {
            return lhs == rhs;
        }
        if (rhs < dsp1_mask) {
            return false;
        }

        lhs = aux_cht_.get(slot_id);
        if (lhs != aux_cht_type::nil) {
            return lhs + dsp1_mask == rhs;
        }
        if (rhs < dsp1_mask + dsp2_mask) {
            return false;
        }

        auto val = aux_map_.get(slot_id);
        assert(val != aux_map_type::nil);
        return val == rhs;
    }